

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
::find_impl<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  byte unaff_BPL;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i match;
  long local_90;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::shared_ptr<cs::name_space>_&>_>
  local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  uVar2 = *(ulong *)(this + 0x18);
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar9 = hashval >> 7 & uVar2;
  auVar11 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar11 = pshuflw(auVar11,auVar11,0);
  local_58 = auVar11._0_4_;
  local_90 = 0;
  uStack_54 = local_58;
  uStack_50 = local_58;
  uStack_4c = local_58;
  do {
    pcVar1 = (char *)(*(long *)this + uVar9);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    cStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    cStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    cStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    cStack_39 = pcVar1[0xf];
    auVar11[0] = -((char)local_58 == local_48);
    auVar11[1] = -(local_58._1_1_ == cStack_47);
    auVar11[2] = -(local_58._2_1_ == cStack_46);
    auVar11[3] = -(local_58._3_1_ == cStack_45);
    auVar11[4] = -((char)uStack_54 == cStack_44);
    auVar11[5] = -(uStack_54._1_1_ == cStack_43);
    auVar11[6] = -(uStack_54._2_1_ == cStack_42);
    auVar11[7] = -(uStack_54._3_1_ == cStack_41);
    auVar11[8] = -((char)uStack_50 == cStack_40);
    auVar11[9] = -(uStack_50._1_1_ == cStack_3f);
    auVar11[10] = -(uStack_50._2_1_ == cStack_3e);
    auVar11[0xb] = -(uStack_50._3_1_ == cStack_3d);
    auVar11[0xc] = -((char)uStack_4c == cStack_3c);
    auVar11[0xd] = -(uStack_4c._1_1_ == cStack_3b);
    auVar11[0xe] = -(uStack_4c._2_1_ == cStack_3a);
    auVar11[0xf] = -(uStack_4c._3_1_ == cStack_39);
    uVar4 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf;
    bVar10 = uVar4 == 0;
    if (!bVar10) {
      uVar8 = (uint)uVar4;
      do {
        uVar3 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar6 = uVar3 + uVar9 & uVar2;
        *offset = uVar6;
        lVar7 = uVar6 * 0x30;
        local_68.first.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )(*(long *)(this + 8) + lVar7);
        local_68.second.super__Tuple_impl<0UL,_const_std::shared_ptr<cs::name_space>_&>.
        super__Head_base<0UL,_const_std::shared_ptr<cs::name_space>_&,_false>._M_head_impl =
             (_Tuple_impl<0UL,_const_std::shared_ptr<cs::name_space>_&>)
             (lVar7 + *(long *)(this + 8) + 0x20);
        local_78.rhs = key;
        local_78.eq = (key_equal *)(this + 0x28);
        bVar5 = memory_internal::
                DecomposePairImpl<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::shared_ptr<cs::name_space>const&>>
                          (&local_78,&local_68);
        unaff_BPL = unaff_BPL | bVar5;
        if (bVar5) break;
        uVar8 = uVar8 - 1 & uVar8;
        bVar10 = uVar8 == 0;
      } while (!bVar10);
    }
    if (bVar10) {
      auVar12[0] = -(local_48 == -0x80);
      auVar12[1] = -(cStack_47 == -0x80);
      auVar12[2] = -(cStack_46 == -0x80);
      auVar12[3] = -(cStack_45 == -0x80);
      auVar12[4] = -(cStack_44 == -0x80);
      auVar12[5] = -(cStack_43 == -0x80);
      auVar12[6] = -(cStack_42 == -0x80);
      auVar12[7] = -(cStack_41 == -0x80);
      auVar12[8] = -(cStack_40 == -0x80);
      auVar12[9] = -(cStack_3f == -0x80);
      auVar12[10] = -(cStack_3e == -0x80);
      auVar12[0xb] = -(cStack_3d == -0x80);
      auVar12[0xc] = -(cStack_3c == -0x80);
      auVar12[0xd] = -(cStack_3b == -0x80);
      auVar12[0xe] = -(cStack_3a == -0x80);
      auVar12[0xf] = -(cStack_39 == -0x80);
      if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar12 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar12 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar12 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar12 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar12 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar12 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar12 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar12 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar12 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar12 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar12 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar12 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar12 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar12 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar12[0xf])
      {
        lVar7 = uVar9 + local_90;
        local_90 = local_90 + 0x10;
        uVar9 = lVar7 + 0x10U & uVar2;
        bVar10 = true;
      }
      else {
        bVar10 = false;
        unaff_BPL = 0;
      }
    }
    else {
      bVar10 = false;
    }
    if (!bVar10) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool find_impl(const key_arg<K>& key, size_t hashval, size_t& offset)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ ctrl_ + seq.offset() };
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						offset = seq.offset((size_t)i);
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + offset))))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
						return false;
					seq.next();
				}
			}